

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-util.c++
# Opt level: O2

Promise<void> __thiscall
capnp::_::TestMoreStuffImpl::hold(TestMoreStuffImpl *this,HoldContext context)

{
  PromiseNode *extraout_RDX;
  Promise<void> PVar1;
  Reader params;
  undefined1 local_70 [24];
  CallContext<capnproto_test::capnp::test::TestMoreStuff::HoldParams,_capnproto_test::capnp::test::TestMoreStuff::HoldResults>
  local_58;
  Reader local_50;
  
  *(int *)context.hook[1]._vptr_CallContextHook = *(int *)context.hook[1]._vptr_CallContextHook + 1;
  CallContext<capnproto_test::capnp::test::TestMoreStuff::HoldParams,_capnproto_test::capnp::test::TestMoreStuff::HoldResults>
  ::getParams(&local_50,&local_58);
  capnproto_test::capnp::test::TestMoreStuff::HoldParams::Reader::getCap
            ((Client *)local_70,&local_50);
  capnproto_test::capnp::test::TestInterface::Client::operator=
            ((Client *)(context.hook + 3),(Client *)local_70);
  kj::Own<capnp::ClientHook>::dispose((Own<capnp::ClientHook> *)(local_70 + 8));
  kj::Promise<void>::Promise((Promise<void> *)this);
  PVar1.super_PromiseBase.node.ptr = extraout_RDX;
  PVar1.super_PromiseBase.node.disposer = (Disposer *)this;
  return (Promise<void>)PVar1.super_PromiseBase.node;
}

Assistant:

kj::Promise<void> TestMoreStuffImpl::hold(HoldContext context) {
  ++callCount;

  auto params = context.getParams();
  clientToHold = params.getCap();
  return kj::READY_NOW;
}